

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

bool cppjieba::DecodeRunesInString(char *s,size_t len,RuneStrArray *runes)

{
  RuneStrLite RVar1;
  ulong in_RSI;
  RuneStr x;
  RuneStrLite rp;
  uint32_t j;
  uint32_t i;
  RuneStr *in_stack_ffffffffffffffb8;
  LocalVector<cppjieba::RuneStr> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  LocalVector<cppjieba::RuneStr> *in_stack_ffffffffffffffd0;
  uint32_t uVar2;
  uint32_t local_28;
  uint local_24;
  
  limonp::LocalVector<cppjieba::RuneStr>::clear(in_stack_ffffffffffffffc0);
  limonp::LocalVector<cppjieba::RuneStr>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    if (in_RSI <= local_24) {
      return true;
    }
    RVar1 = DecodeRuneInString((char *)in_stack_ffffffffffffffb8,0x1436bb);
    if (RVar1.len == 0) break;
    RuneStr::RuneStr((RuneStr *)&stack0xffffffffffffffbc,RVar1.rune,local_24,RVar1.len,local_28,1);
    uVar2 = RVar1.len;
    limonp::LocalVector<cppjieba::RuneStr>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_24 = uVar2 + local_24;
    local_28 = local_28 + 1;
  }
  limonp::LocalVector<cppjieba::RuneStr>::clear(in_stack_ffffffffffffffc0);
  return false;
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, RuneStrArray& runes) {
  runes.clear();
  runes.reserve(len / 2);
  for (uint32_t i = 0, j = 0; i < len;) {
    RuneStrLite rp = DecodeRuneInString(s + i, len - i);
    if (rp.len == 0) {
      runes.clear();
      return false;
    }
    RuneStr x(rp.rune, i, rp.len, j, 1);
    runes.push_back(x);
    i += rp.len;
    ++j;
  }
  return true;
}